

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::Detail::Approx::toString_abi_cxx11_(Approx *this)

{
  ReusableStringStream *this_00;
  string *in_RDI;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string *this_01;
  string local_58 [8];
  ReusableStringStream *in_stack_ffffffffffffffb0;
  ReusableStringStream *in_stack_ffffffffffffffc0;
  
  this_01 = in_RDI;
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)this_01,(char (*) [9])in_stack_ffffffffffffff78);
  stringify<double>((double *)in_stack_ffffffffffffff78);
  this_00 = ReusableStringStream::operator<<
                      ((ReusableStringStream *)this_01,in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<((ReusableStringStream *)this_01,(char (*) [3])this_00);
  std::__cxx11::string::~string(local_58);
  ReusableStringStream::str_abi_cxx11_(this_00);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify( m_value ) << " )";
        return rss.str();
    }